

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O0

string * __thiscall
Symbol_Table::get_type(string *__return_storage_ptr__,Symbol_Table *this,string *identifier)

{
  size_type sVar1;
  mapped_type *ppIVar2;
  string *identifier_local;
  Symbol_Table *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
          ::count(&this->class_scope,identifier);
  if (sVar1 == 0) {
    ppIVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
              ::operator[](&this->subroutine_scope,identifier);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)*ppIVar2);
  }
  else {
    ppIVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
              ::operator[](&this->class_scope,identifier);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)*ppIVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Symbol_Table::get_type(const std::string& identifier) {
    if (class_scope.count(identifier) > 0) {
        return class_scope[identifier]->type;
    }
    return subroutine_scope[identifier]->type;
}